

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O2

int ReadTIFF(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  byte bVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  WebPPicture *pWVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  WebPPicture *pWVar11;
  uint32_t uVar12;
  long lVar13;
  ulong uVar14;
  uint64_t stride;
  size_t __size;
  uint32_t image_height;
  uint16_t samples_per_px;
  uint32_t image_width;
  uint16_t extra_samples;
  WebPPicture *local_78;
  uint32_t tile_height;
  uint32_t tile_width;
  uint local_64;
  uint16_t *extra_samples_ptr;
  void *tag_data;
  MyData my_data;
  toff_t exif_ifd_offset;
  
  my_data.pos = 0;
  samples_per_px = 0;
  extra_samples = 0;
  extra_samples_ptr = (uint16_t *)0x0;
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  if (data == (uint8_t *)0x0) {
    return 0;
  }
  if (data_size - 0x80000000 < 0xffffffff80000001) {
    return 0;
  }
  my_data.data = data;
  my_data.size = data_size;
  lVar6 = TIFFClientOpen("Memory","r",&my_data,MyRead,MyRead,MySeek,MyClose,MySize,MyMapFile,
                         MyUnmapFile);
  if (lVar6 == 0) {
    fwrite("Error! Cannot parse TIFF file\n",0x1e,1,_stderr);
    return 0;
  }
  uVar3 = TIFFNumberOfDirectories(lVar6);
  if (1 < uVar3) {
    fprintf(_stderr,
            "Warning: multi-directory TIFF files are not supported.\nOnly the first will be used, %d will be ignored.\n"
            ,(ulong)(uVar3 - 1));
  }
  iVar5 = 0;
  iVar4 = TIFFGetFieldDefaulted(lVar6,0x115,&samples_per_px);
  if (iVar4 == 0) {
    pcVar10 = "Error! Cannot retrieve TIFF samples-per-pixel info.\n";
    __size = 0x34;
  }
  else {
    if ((ushort)(samples_per_px - 5) < 0xfffe) goto LAB_0010986b;
    iVar5 = TIFFGetField(lVar6,0x100,&image_width);
    if ((iVar5 != 0) && (iVar5 = TIFFGetField(lVar6,0x101,&image_height), iVar5 != 0)) {
      uVar14 = (ulong)image_width;
      stride = uVar14 * 4;
      iVar5 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(ulong)image_height);
      if (iVar5 == 0) {
        uVar8 = (ulong)image_width;
        pcVar10 = "Error! TIFF image dimension (%d x %d) is too large.\n";
        tile_height = image_height;
      }
      else {
        iVar5 = TIFFGetField(lVar6,0x142,&tile_width);
        if ((iVar5 == 0) || (iVar5 = TIFFGetField(lVar6,0x143,&tile_height), iVar5 == 0)) {
LAB_0010955b:
          if ((samples_per_px < 4) ||
             (iVar5 = TIFFGetField(lVar6,0x152,&extra_samples,&extra_samples_ptr), iVar5 != 0)) {
            iVar5 = 0;
            if ((long)(image_height * stride) < 0) goto LAB_0010986b;
            pWVar7 = (WebPPicture *)_TIFFmalloc();
            if (pWVar7 != (WebPPicture *)0x0) {
              local_78 = pWVar7;
              iVar5 = TIFFReadRGBAImageOriented(lVar6,image_width,image_height,pWVar7,1,1);
              pWVar7 = local_78;
              if (iVar5 == 0) {
                iVar5 = 0;
              }
              else {
                pic->width = image_width;
                pic->height = image_height;
                if ((extra_samples_ptr != (uint16_t *)0x0 && extra_samples == 1) &&
                   (*extra_samples_ptr == 1)) {
                  pWVar11 = local_78;
                  for (uVar9 = 0; uVar9 < image_height; uVar9 = uVar9 + 1) {
                    uVar12 = image_width;
                    if ((int)image_width < 1) {
                      uVar12 = 0;
                    }
                    for (lVar13 = 0; uVar12 != (uint32_t)lVar13; lVar13 = lVar13 + 1) {
                      bVar1 = *(byte *)((long)pWVar11->pad1 + lVar13 * 4 + -0x39);
                      if (bVar1 != 0xff) {
                        if (bVar1 == 0) {
                          *(undefined2 *)((long)pWVar11->pad1 + lVar13 * 4 + -0x3b) = 0;
                          *(undefined1 *)(pWVar11->pad1 + lVar13 + -0xf) = 0;
                        }
                        else {
                          iVar5 = (int)(0xff000000 / (ulong)bVar1);
                          *(char *)(pWVar11->pad1 + lVar13 + -0xf) =
                               (char)((uint)(byte)pWVar11->pad1[lVar13 + -0xf] * iVar5 + 0x800000 >>
                                     0x18);
                          *(char *)((long)pWVar11->pad1 + lVar13 * 4 + -0x3b) =
                               (char)((uint)*(byte *)((long)pWVar11->pad1 + lVar13 * 4 + -0x3b) *
                                      iVar5 + 0x800000 >> 0x18);
                          *(char *)((long)pWVar11->pad1 + lVar13 * 4 + -0x3a) =
                               (char)((uint)*(byte *)((long)pWVar11->pad1 + lVar13 * 4 + -0x3a) *
                                      iVar5 + 0x800000 >> 0x18);
                        }
                      }
                    }
                    pWVar11 = (WebPPicture *)(pWVar11->pad1 + (uVar14 - 0xf));
                  }
                }
                if (keep_alpha == 0) {
                  iVar5 = WebPPictureImportRGBX(pic,(uint8_t *)local_78,(int)stride);
                }
                else {
                  iVar5 = WebPPictureImportRGBA(pic,(uint8_t *)local_78,(int)stride);
                }
              }
              _TIFFfree(pWVar7);
              if ((metadata != (Metadata *)0x0) && (iVar5 != 0)) {
                local_78 = pic;
                for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 0x10) {
                  lVar2 = *(long *)((long)&kTIFFMetadataMap[0].storage_offset + lVar13);
                  iVar5 = TIFFGetField(lVar6,*(undefined4 *)
                                              ((long)&kTIFFMetadataMap[0].tag + lVar13),&local_64,
                                       &tag_data);
                  if ((iVar5 != 0) &&
                     (iVar5 = MetadataCopy((char *)tag_data,(ulong)local_64,
                                           (MetadataPayload *)
                                           ((long)&(metadata->exif).bytes + lVar2)), iVar5 == 0)) {
                    fwrite("Error extracting TIFF metadata!\n",0x20,1,_stderr);
                    MetadataFree(metadata);
                    WebPPictureFree(local_78);
                    iVar5 = 0;
                    goto LAB_0010986b;
                  }
                }
                iVar5 = TIFFGetField(lVar6,0x8769,&exif_ifd_offset);
                if (iVar5 != 0) {
                  fwrite("Warning: EXIF extraction from TIFF is unsupported.\n",0x33,1,_stderr);
                }
                iVar5 = 1;
              }
              goto LAB_0010986b;
            }
            pcVar10 = "Error allocating TIFF RGBA memory!\n";
            __size = 0x23;
          }
          else {
            pcVar10 = "Error! Cannot retrieve TIFF ExtraSamples info.\n";
            __size = 0x2f;
          }
          goto LAB_00109740;
        }
        uVar8 = (ulong)tile_width;
        if (((uVar8 < 0x21) || (tile_width >> 1 <= image_width)) &&
           (((ulong)tile_height < 0x21 || (tile_height >> 1 <= image_height)))) {
          iVar5 = ImgIoUtilCheckSizeArgumentsOverflow(uVar8 << 2,(ulong)tile_height);
          if (iVar5 == 0) goto LAB_0010955b;
          uVar8 = (ulong)tile_width;
        }
        pcVar10 = "Error! TIFF tile dimension (%d x %d) is too large.\n";
      }
      iVar5 = 0;
      fprintf(_stderr,pcVar10,uVar8,(ulong)tile_height);
      goto LAB_0010986b;
    }
    pcVar10 = "Error! Cannot retrieve TIFF image dimensions.\n";
    __size = 0x2e;
  }
LAB_00109740:
  iVar5 = 0;
  fwrite(pcVar10,__size,1,_stderr);
LAB_0010986b:
  TIFFClose(lVar6);
  return iVar5;
}

Assistant:

int ReadTIFF(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  MyData my_data = { data, (toff_t)data_size, 0 };
  TIFF* tif;
  uint32_t image_width, image_height, tile_width, tile_height;
  uint64_t stride;
  uint16_t samples_per_px = 0;
  uint16_t extra_samples = 0;
  uint16_t* extra_samples_ptr = NULL;
  uint32_t* raster;
  int64_t alloc_size;
  int ok = 0;
  tdir_t dircount;

  if (data == NULL || data_size == 0 || data_size > INT_MAX || pic == NULL) {
    return 0;
  }

  tif = TIFFClientOpen("Memory", "r", &my_data,
                       MyRead, MyRead, MySeek, MyClose,
                       MySize, MyMapFile, MyUnmapFile);
  if (tif == NULL) {
    fprintf(stderr, "Error! Cannot parse TIFF file\n");
    return 0;
  }

  dircount = TIFFNumberOfDirectories(tif);
  if (dircount > 1) {
    fprintf(stderr, "Warning: multi-directory TIFF files are not supported.\n"
                    "Only the first will be used, %d will be ignored.\n",
                    dircount - 1);
  }
  if (!TIFFGetFieldDefaulted(tif, TIFFTAG_SAMPLESPERPIXEL, &samples_per_px)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF samples-per-pixel info.\n");
    goto End;
  }
  if (samples_per_px < 3 || samples_per_px > 4) goto End;  // not supported

  if (!(TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &image_width) &&
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &image_height))) {
    fprintf(stderr, "Error! Cannot retrieve TIFF image dimensions.\n");
    goto End;
  }
  stride = (uint64_t)image_width * sizeof(*raster);
  if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, image_height)) {
    fprintf(stderr, "Error! TIFF image dimension (%d x %d) is too large.\n",
            image_width, image_height);
    goto End;
  }

  // According to spec, a tile can be bigger than the image. However it should
  // be a multiple of 16 and not way too large, so check that it's not more
  // than twice the image size, for dimensions above some arbitrary minimum
  // 32. We also check that they respect WebP's dimension and memory limit.
  // Note that a tile can be 6byte/px in some cases. Here we assume
  // 4byte/px with sizeof(*raster), to be conservative.
  if (TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tile_width) &&
      TIFFGetField(tif, TIFFTAG_TILELENGTH, &tile_height)) {
    if ((tile_width > 32 && tile_width / 2 > image_width) ||
        (tile_height > 32 && tile_height / 2 > image_height) ||
        ImgIoUtilCheckSizeArgumentsOverflow(
            (uint64_t)tile_width * sizeof(*raster), tile_height)) {
      fprintf(stderr, "Error! TIFF tile dimension (%d x %d) is too large.\n",
              tile_width, tile_height);
      goto End;
    }
  }

  if (samples_per_px > 3 && !TIFFGetField(tif, TIFFTAG_EXTRASAMPLES,
                                          &extra_samples, &extra_samples_ptr)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF ExtraSamples info.\n");
    goto End;
  }

  // _Tiffmalloc uses a signed type for size.
  alloc_size = (int64_t)(stride * image_height);
  if (alloc_size < 0 || alloc_size != (tsize_t)alloc_size) goto End;

  raster = (uint32_t*)_TIFFmalloc((tsize_t)alloc_size);
  if (raster != NULL) {
    if (TIFFReadRGBAImageOriented(tif, image_width, image_height, raster,
                                  ORIENTATION_TOPLEFT, 1)) {
      pic->width = image_width;
      pic->height = image_height;
      // TIFF data is ABGR
#ifdef WORDS_BIGENDIAN
      TIFFSwabArrayOfLong(raster, image_width * image_height);
#endif
      // if we have an alpha channel, we must un-multiply from rgbA to RGBA
      if (extra_samples == 1 && extra_samples_ptr != NULL &&
          extra_samples_ptr[0] == EXTRASAMPLE_ASSOCALPHA) {
        uint32_t y;
        uint8_t* tmp = (uint8_t*)raster;
        for (y = 0; y < image_height; ++y) {
          MultARGBRow(tmp, image_width);
          tmp += stride;
        }
      }
      ok = keep_alpha
         ? WebPPictureImportRGBA(pic, (const uint8_t*)raster, (int)stride)
         : WebPPictureImportRGBX(pic, (const uint8_t*)raster, (int)stride);
    }
    _TIFFfree(raster);
  } else {
    fprintf(stderr, "Error allocating TIFF RGBA memory!\n");
  }

  if (ok) {
    if (metadata != NULL) {
      ok = ExtractMetadataFromTIFF(tif, metadata);
      if (!ok) {
        fprintf(stderr, "Error extracting TIFF metadata!\n");
        MetadataFree(metadata);
        WebPPictureFree(pic);
      }
    }
  }
 End:
  TIFFClose(tif);
  return ok;
}